

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O2

void __thiscall asl::XdlParser::end_object(XdlParser *this)

{
  Var *pVVar1;
  Var v;
  Var local_20;
  
  pVVar1 = (this->_lists).super_Array<asl::Var>._a;
  Var::Var(&local_20,pVVar1 + (long)(int)pVVar1[-1]._type + -1);
  Stack<asl::Var>::pop(&this->_lists);
  put(this,&local_20);
  Var::~Var(&local_20);
  return;
}

Assistant:

void XdlParser::end_object()
{
	Var v = _lists.top();
	_lists.pop();
	put(v);
}